

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_stats.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  string_view filename_00;
  ostream *poVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  ulong local_2c8;
  size_t i;
  vector<long_double,_std::allocator<long_double>_> vars;
  vector<long_double,_std::allocator<long_double>_> means;
  vector<long_double,_std::allocator<long_double>_> max;
  vector<long_double,_std::allocator<long_double>_> min;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  col_names;
  undefined1 local_1e0 [8];
  CSVStat stats;
  allocator<char> local_39;
  string local_38 [8];
  string filename;
  char **argv_local;
  int argc_local;
  
  filename.field_2._8_8_ = argv;
  if (argc < 2) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar1 = std::operator<<(poVar1,*(char **)filename.field_2._8_8_);
    poVar1 = std::operator<<(poVar1," [file]");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  __s = argv[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
  std::allocator<char>::~allocator(&local_39);
  filename_00 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_38);
  csv::CSVFormat::guess_csv();
  csv::CSVStat::CSVStat
            ((CSVStat *)local_1e0,filename_00,
             (CSVFormat *)
             &col_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  csv::CSVFormat::~CSVFormat
            ((CSVFormat *)
             &col_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  csv::CSVStat::get_col_names_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&min.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,(CSVStat *)local_1e0);
  csv::CSVStat::get_mins
            ((vector<long_double,_std::allocator<long_double>_> *)
             &max.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(CSVStat *)local_1e0);
  csv::CSVStat::get_maxes
            ((vector<long_double,_std::allocator<long_double>_> *)
             &means.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(CSVStat *)local_1e0);
  csv::CSVStat::get_mean
            ((vector<long_double,_std::allocator<long_double>_> *)
             &vars.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(CSVStat *)local_1e0);
  csv::CSVStat::get_variance
            ((vector<long_double,_std::allocator<long_double>_> *)&i,(CSVStat *)local_1e0);
  local_2c8 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&min.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    if (sVar2 <= local_2c8) break;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&min.super__Vector_base<long_double,_std::allocator<long_double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,local_2c8);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)pvVar3);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(poVar1,"Min: ");
    pvVar4 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                       ((vector<long_double,_std::allocator<long_double>_> *)
                        &max.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,local_2c8);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(longdouble *)pvVar4);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(poVar1,"Max: ");
    pvVar4 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                       ((vector<long_double,_std::allocator<long_double>_> *)
                        &means.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage,local_2c8);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(longdouble *)pvVar4);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(poVar1,"Mean: ");
    pvVar4 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                       ((vector<long_double,_std::allocator<long_double>_> *)
                        &vars.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,local_2c8);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(longdouble *)pvVar4);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(poVar1,"Var: ");
    pvVar4 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                       ((vector<long_double,_std::allocator<long_double>_> *)&i,local_2c8);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(longdouble *)pvVar4);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_2c8 = local_2c8 + 1;
  }
  std::vector<long_double,_std::allocator<long_double>_>::~vector
            ((vector<long_double,_std::allocator<long_double>_> *)&i);
  std::vector<long_double,_std::allocator<long_double>_>::~vector
            ((vector<long_double,_std::allocator<long_double>_> *)
             &vars.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long_double,_std::allocator<long_double>_>::~vector
            ((vector<long_double,_std::allocator<long_double>_> *)
             &means.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long_double,_std::allocator<long_double>_>::~vector
            ((vector<long_double,_std::allocator<long_double>_> *)
             &max.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&min.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  csv::CSVStat::~CSVStat((CSVStat *)local_1e0);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    using namespace csv;

    if (argc < 2) {
        std::cout << "Usage: " << argv[0] << " [file]" << std::endl;
        exit(1);
    }

    std::string filename = argv[1];
    CSVStat stats(filename);

    auto col_names = stats.get_col_names();
    auto min = stats.get_mins(), max = stats.get_maxes(),
        means = stats.get_mean(), vars = stats.get_variance();

    for (size_t i = 0; i < col_names.size(); i++) {
        std::cout << col_names[i] << std::endl
            << "Min: " << min[i] << std::endl
            << "Max: " << max[i] << std::endl
            << "Mean: " << means[i] << std::endl
            << "Var: " << vars[i] << std::endl;
    }

    return 0;
}